

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int lj_cf_os_exit(lua_State *L)

{
  uint __status;
  long in_RDI;
  lua_State *unaff_retaddr;
  int status;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((*(ulong *)(in_RDI + 0x10) < *(ulong *)(in_RDI + 0x18)) &&
     ((*(int *)(*(long *)(in_RDI + 0x10) + 4) == -2 ||
      (*(int *)(*(long *)(in_RDI + 0x10) + 4) == -3)))) {
    __status = (uint)(*(int *)(*(long *)(in_RDI + 0x10) + 4) == -2);
  }
  else {
    __status = lj_lib_optint(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
  }
  if ((*(long *)(in_RDI + 0x10) + 8U < *(ulong *)(in_RDI + 0x18)) &&
     (*(uint *)(*(long *)(in_RDI + 0x10) + 0xc) < 0xfffffffe)) {
    lua_close((lua_State *)CONCAT44(__status,in_stack_fffffffffffffff0));
  }
  exit(__status);
}

Assistant:

LJLIB_CF(os_exit)
{
  int status;
  if (L->base < L->top && tvisbool(L->base))
    status = boolV(L->base) ? EXIT_SUCCESS : EXIT_FAILURE;
  else
    status = lj_lib_optint(L, 1, EXIT_SUCCESS);
  if (L->base+1 < L->top && tvistruecond(L->base+1))
    lua_close(L);
  exit(status);
  return 0;  /* Unreachable. */
}